

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

String * asl::Url::decode(String *__return_storage_ptr__,String *q0)

{
  int iVar1;
  ulong in_RAX;
  ulong uVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  int iVar4;
  char b [3];
  undefined8 uStack_38;
  
  iVar4 = 0;
  (__return_storage_ptr__->field_2)._space[0] = '\0';
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_len = 0;
  uStack_38 = in_RAX & 0xffffffffffffff;
  iVar1 = q0->_len;
  if (0 < iVar1) {
    do {
      uVar2 = uStack_38;
      paVar3 = &q0->field_2;
      if (q0->_size != 0) {
        paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(q0->field_2)._str;
      }
      if (paVar3->_space[iVar4] == '%') {
        if (iVar1 + -2 < iVar4) {
          return __return_storage_ptr__;
        }
        uStack_38._7_1_ = SUB81(uVar2,7);
        uStack_38._0_7_ =
             CONCAT16(paVar3->_space[(long)iVar4 + 2],
                      CONCAT15(paVar3->_space[(long)iVar4 + 1],(undefined5)uStack_38));
        uVar2 = strtoul((char *)((long)&uStack_38 + 5),(char **)0x0,0x10);
        String::operator+=(__return_storage_ptr__,(char)uVar2);
        iVar4 = iVar4 + 2;
      }
      else {
        String::operator+=(__return_storage_ptr__,paVar3->_space[iVar4]);
      }
      iVar4 = iVar4 + 1;
      iVar1 = q0->_len;
    } while (iVar4 < iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String Url::decode(const String& q0)
{
	String q;
	char   b[3];
	b[2] = '\0';
	for (int i = 0; i < q0.length(); i++)
	{
		char c = q0[i];
		if (c == '%')
		{
			if (i > q0.length() - 2)
				break;
			b[0] = q0[i + 1];
			b[1] = q0[i + 2];
			q << (char)strtoul(b, NULL, 16);
			i += 2;
		}
		else
		q << c;
	}
#ifdef ASL_ANSI
	return utf8ToLocal(q);
#else
	return q;
#endif
}